

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsEmpty(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> v;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_18 [4];
  
  local_18[0] = 1;
  local_18[1] = 2;
  local_18[2] = 3;
  local_18[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_31);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int testSpanTestsEmpty()
{
    // test 0 length but valud ptr
    std::vector<int> v = {1, 2, 3, 4};
    Span<int> span(v.data(), 0);
    ML_ASSERT(span.IsEmpty());
    ML_ASSERT_EQ(span.Size(), size_t(0));
    ML_ASSERT_EQ(span.Data(), nullptr);

    return 0;
}